

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  MemoryManager *pMVar4;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar5;
  undefined4 extraout_var;
  DTDAttDef *local_50;
  DTDAttDef *data;
  XMLSize_t itemIndex;
  XMLSize_t itemNumber;
  XMLSize_t local_28;
  XMLSize_t hashModulus;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> **ppRStack_10;
  int param_1_local;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> **objToLoad_local;
  
  hashModulus = (XMLSize_t)serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = param_2;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&local_28);
    if (*ppRStack_10 == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar4 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      pRVar5 = (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x38,pMVar4);
      bVar1 = serEng_local._3_1_;
      pMVar4 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::RefHashTableOf
                (pRVar5,local_28,(bool)(bVar1 & 1),pMVar4);
      *ppRStack_10 = pRVar5;
    }
    XSerializeEngine::registerObject((XSerializeEngine *)hashModulus,*ppRStack_10);
    itemIndex = 0;
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&itemIndex);
    for (data = (DTDAttDef *)0x0; data < itemIndex;
        data = (DTDAttDef *)
               ((long)&(data->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1)) {
      xercesc_4_0::operator>>((XSerializeEngine *)hashModulus,&local_50);
      pRVar5 = *ppRStack_10;
      iVar3 = (*(local_50->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
      RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::put
                (pRVar5,(void *)CONCAT44(extraout_var,iVar3),local_50);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<DTDAttDef>** objToLoad
                                   , int
                                   , bool                        toAdopt
                                   , XSerializeEngine&           serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {

        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<DTDAttDef>(
                                                       hashModulus
                                                     , toAdopt
                                                     , serEng.getMemoryManager()
                                                      );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DTDAttDef*  data;
            serEng>>data;

            (*objToLoad)->put((void*)data->getFullName(), data);
        }
    }
}